

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

void __thiscall
duckdb::ClientContext::RebindPreparedStatement
          (ClientContext *this,ClientContextLock *lock,string *query,
          shared_ptr<duckdb::PreparedStatementData,_true> *prepared,
          PendingQueryParameters *parameters)

{
  idx_t iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  PreparedStatementData *pPVar4;
  pointer pSVar5;
  InternalException *this_01;
  string *query_00;
  long *local_60;
  undefined1 local_58 [40];
  
  pPVar4 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(prepared);
  if ((pPVar4->unbound_statement).
      super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl != (SQLStatement *)0x0) {
    pPVar4 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(prepared);
    pSVar5 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(&pPVar4->unbound_statement);
    (*pSVar5->_vptr_SQLStatement[3])
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                *)&local_60,pSVar5);
    CreatePreparedStatement
              ((ClientContext *)local_58,(ClientContextLock *)this,query_00,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               query,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                      *)&local_60,(PreparedStatementMode)(parameters->parameters).ptr);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
    local_60 = (long *)0x0;
    pPVar4 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(prepared);
    iVar1 = (pPVar4->properties).parameter_count;
    pPVar4 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                       ((shared_ptr<duckdb::PreparedStatementData,_true> *)local_58);
    uVar3 = local_58._8_8_;
    uVar2 = local_58._0_8_;
    (pPVar4->properties).parameter_count = iVar1;
    local_58._0_8_ = (element_type *)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (prepared->internal).
              super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (prepared->internal).
    super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar2;
    (prepared->internal).
    super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pPVar4 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(prepared);
    (pPVar4->properties).bound_all_parameters = false;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    return;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_58._0_8_ = local_58 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "ClientContext::RebindPreparedStatement called but PreparedStatementData did not have an unbound statement so rebinding cannot be done"
             ,"");
  InternalException::InternalException(this_01,(string *)local_58);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ClientContext::RebindPreparedStatement(ClientContextLock &lock, const string &query,
                                            shared_ptr<PreparedStatementData> &prepared,
                                            const PendingQueryParameters &parameters) {
	if (!prepared->unbound_statement) {
		throw InternalException("ClientContext::RebindPreparedStatement called but PreparedStatementData did not have "
		                        "an unbound statement so rebinding cannot be done");
	}
	// catalog was modified: rebind the statement before execution
	auto new_prepared =
	    CreatePreparedStatement(lock, query, prepared->unbound_statement->Copy(), parameters.parameters);
	D_ASSERT(new_prepared->properties.bound_all_parameters);
	new_prepared->properties.parameter_count = prepared->properties.parameter_count;
	prepared = std::move(new_prepared);
	prepared->properties.bound_all_parameters = false;
}